

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O3

CameraIntrinsics
polyscope::CameraIntrinsics::fromFoVDegHorizontalAndVertical(float *fovHorzDeg,float *fovVertDeg)

{
  undefined4 extraout_EAX;
  float fVar1;
  CameraIntrinsics CVar2;
  float aspectRatioWidthOverHeight;
  float local_24;
  CameraIntrinsics local_20;
  
  fVar1 = tanf(*fovHorzDeg * 0.017453292 * 0.5);
  local_24 = tanf(*fovVertDeg * 0.017453292 * 0.5);
  local_24 = fVar1 / local_24;
  CameraIntrinsics(&local_20,fovVertDeg,&local_24);
  CVar2._9_3_ = (undefined3)((uint)extraout_EAX >> 8);
  CVar2.isValidFlag = local_20.isValidFlag;
  CVar2.fovVerticalDegrees = local_20.fovVerticalDegrees;
  CVar2.aspectRatioWidthOverHeight = local_20.aspectRatioWidthOverHeight;
  return CVar2;
}

Assistant:

CameraIntrinsics CameraIntrinsics::fromFoVDegHorizontalAndVertical(const float& fovHorzDeg, const float& fovVertDeg) {
  float aspectRatioWidthOverHeight =
      std::tan(0.5f * glm::radians(fovHorzDeg)) / std::tan(0.5f * glm::radians(fovVertDeg));
  return CameraIntrinsics(fovVertDeg, aspectRatioWidthOverHeight);
}